

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta.cpp
# Opt level: O1

void cpp_client::morph_any(Any *to_morph,Value *val)

{
  uint uVar1;
  undefined4 uVar2;
  char *pcVar3;
  _Head_base<0UL,_cpp_client::Any::holder_*,_false> _Var4;
  int iVar5;
  undefined *puVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  type pbVar7;
  undefined4 extraout_var_04;
  Ch *pCVar8;
  undefined4 extraout_var_05;
  _Head_base<0UL,_cpp_client::Any::holder_*,_false> _Var9;
  type piVar10;
  type pdVar11;
  Bad_manipulation *this;
  pointer_____offset_0x10___ *ppuVar12;
  bool bVar13;
  allocator local_59;
  _func_int **local_58;
  _Head_base<0UL,_cpp_client::Any::holder_*,_false> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  _Var9._M_head_impl =
       (to_morph->data_)._M_t.
       super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
       ._M_t.
       super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
       .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl;
  puVar6 = &void::typeinfo;
  if (_Var9._M_head_impl != (holder *)0x0) {
    iVar5 = (*(_Var9._M_head_impl)->_vptr_holder[2])();
    puVar6 = (undefined *)CONCAT44(extraout_var,iVar5);
  }
  pcVar3 = *(char **)(puVar6 + 8);
  if (pcVar3 == _bcmp) {
    bVar13 = true;
  }
  else if (*pcVar3 == '*') {
    bVar13 = false;
  }
  else {
    iVar5 = strcmp(pcVar3,_bcmp);
    bVar13 = iVar5 == 0;
  }
  if ((val->flags_ >> 8 & 1) == 0) {
    if ((val->flags_ >> 10 & 1) != 0) {
      _Var9._M_head_impl =
           (to_morph->data_)._M_t.
           super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
           ._M_t.
           super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
           .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl;
      if (_Var9._M_head_impl == (holder *)0x0) {
        puVar6 = &void::typeinfo;
      }
      else {
        iVar5 = (*(_Var9._M_head_impl)->_vptr_holder[2])();
        puVar6 = (undefined *)CONCAT44(extraout_var_00,iVar5);
      }
      pcVar3 = *(char **)(puVar6 + 8);
      if ((pcVar3 != _typeinfo) &&
         ((*pcVar3 == '*' || (iVar5 = strcmp(pcVar3,_typeinfo), iVar5 != 0)))) {
        if (bVar13) {
          if ((val->flags_ & 0x400) != 0) {
            uVar2 = *(undefined4 *)&val->data_;
            _Var9._M_head_impl = (holder *)operator_new(0x10);
            (_Var9._M_head_impl)->_vptr_holder = (_func_int **)&PTR__holder_0013a590;
            *(undefined4 *)&_Var9._M_head_impl[1]._vptr_holder = uVar2;
            goto LAB_0011fa9e;
          }
LAB_0011fb24:
          __assert_fail("flags_ & kIntFlag",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/siggame[P]Joueur/joueur/libraries/rapidjson/include/rapidjson/document.h"
                        ,0x594,
                        "int rapidjson::GenericValue<rapidjson::UTF8<>>::GetInt() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                       );
        }
        _Var9._M_head_impl =
             (to_morph->data_)._M_t.
             super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
             ._M_t.
             super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
             .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl;
        if (_Var9._M_head_impl == (holder *)0x0) {
          puVar6 = &void::typeinfo;
        }
        else {
          iVar5 = (*(_Var9._M_head_impl)->_vptr_holder[2])();
          puVar6 = (undefined *)CONCAT44(extraout_var_02,iVar5);
        }
        pcVar3 = *(char **)(puVar6 + 8);
        if ((pcVar3 == _put) || ((*pcVar3 != '*' && (iVar5 = strcmp(pcVar3,_put), iVar5 == 0)))) {
          if ((val->flags_ & 0x400) != 0) {
            iVar5 = *(int *)&val->data_;
            piVar10 = Any::as<int>(to_morph);
            *piVar10 = iVar5;
            return;
          }
          goto LAB_0011fb24;
        }
        this = (Bad_manipulation *)__cxa_allocate_exception(0x10);
        Bad_manipulation::runtime_error(this,"Integer assigned to non-Integer.");
        goto LAB_0011fbc0;
      }
    }
    uVar1 = val->flags_;
    if ((uVar1 >> 0x14 & 1) == 0) {
      if ((uVar1 >> 9 & 1) == 0) {
        if (uVar1 == 0) {
          local_48._M_dataplus._M_p = (pointer)0x0;
          local_48._M_string_length = 0;
          _Var9._M_head_impl =
               (to_morph->data_)._M_t.
               super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
               ._M_t.
               super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
               .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl;
          if (_Var9._M_head_impl != (holder *)0x0) {
            (*(_Var9._M_head_impl)->_vptr_holder[5])(_Var9._M_head_impl,&local_48);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length ==
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            return;
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length);
          return;
        }
        this = (Bad_manipulation *)__cxa_allocate_exception(0x10);
        Bad_response::runtime_error((Bad_response *)this,"Unknown JSON type received in a delta.");
        ppuVar12 = &Bad_response::typeinfo;
        goto LAB_0011fbc7;
      }
      if (bVar13) {
        local_58 = (_func_int **)
                   rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::GetDouble(val);
        _Var9._M_head_impl = (holder *)operator_new(0x10);
        (_Var9._M_head_impl)->_vptr_holder = (_func_int **)&PTR__holder_0013a5f8;
        _Var9._M_head_impl[1]._vptr_holder = local_58;
LAB_0011fa9e:
        _Var4._M_head_impl =
             (to_morph->data_)._M_t.
             super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
             ._M_t.
             super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
             .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl;
        (to_morph->data_)._M_t.
        super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
        ._M_t.
        super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
        .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl = _Var9._M_head_impl;
        if (_Var4._M_head_impl == (holder *)0x0) {
          return;
        }
        (*(_Var4._M_head_impl)->_vptr_holder[1])();
        return;
      }
      _Var9._M_head_impl =
           (to_morph->data_)._M_t.
           super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
           ._M_t.
           super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
           .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl;
      if (_Var9._M_head_impl == (holder *)0x0) {
        puVar6 = &void::typeinfo;
      }
      else {
        iVar5 = (*(_Var9._M_head_impl)->_vptr_holder[2])();
        puVar6 = (undefined *)CONCAT44(extraout_var_04,iVar5);
      }
      pcVar3 = *(char **)(puVar6 + 8);
      if ((pcVar3 == _typeinfo) ||
         ((*pcVar3 != '*' && (iVar5 = strcmp(pcVar3,_typeinfo), iVar5 == 0)))) {
        local_58 = (_func_int **)
                   rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::GetDouble(val);
        pdVar11 = Any::as<double>(to_morph);
        *pdVar11 = (double)local_58;
        return;
      }
      this = (Bad_manipulation *)__cxa_allocate_exception(0x10);
      Bad_manipulation::runtime_error(this,"Double assigned to non-double.");
    }
    else {
      if (bVar13) {
        pCVar8 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetString(val);
        std::__cxx11::string::string((string *)&local_48,pCVar8,&local_59);
        Any::Any<std::__cxx11::string>((Any *)&local_50,&local_48);
        _Var4._M_head_impl = local_50._M_head_impl;
        local_50._M_head_impl = (holder *)0x0;
        _Var9._M_head_impl =
             (to_morph->data_)._M_t.
             super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
             ._M_t.
             super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
             .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl;
        (to_morph->data_)._M_t.
        super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
        ._M_t.
        super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
        .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl = _Var4._M_head_impl;
        if (_Var9._M_head_impl != (holder *)0x0) {
          (*(_Var9._M_head_impl)->_vptr_holder[1])();
        }
        if (local_50._M_head_impl != (holder *)0x0) {
          (*(local_50._M_head_impl)->_vptr_holder[1])();
        }
        local_50._M_head_impl = (holder *)0x0;
LAB_0011f9ab:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p == &local_48.field_2) {
          return;
        }
        operator_delete(local_48._M_dataplus._M_p);
        return;
      }
      _Var9._M_head_impl =
           (to_morph->data_)._M_t.
           super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
           ._M_t.
           super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
           .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl;
      if (_Var9._M_head_impl == (holder *)0x0) {
        puVar6 = &void::typeinfo;
      }
      else {
        iVar5 = (*(_Var9._M_head_impl)->_vptr_holder[2])();
        puVar6 = (undefined *)CONCAT44(extraout_var_03,iVar5);
      }
      pcVar3 = *(char **)(puVar6 + 8);
      if ((pcVar3 == "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") ||
         ((*pcVar3 != '*' &&
          (iVar5 = strcmp(pcVar3,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE"), iVar5 == 0
          )))) {
        pCVar8 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetString(val);
        std::__cxx11::string::string((string *)&local_48,pCVar8,(allocator *)&local_50);
        iVar5 = (*((to_morph->data_)._M_t.
                   super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
                   .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl)->
                  _vptr_holder[3])();
        std::__cxx11::string::operator=
                  ((string *)CONCAT44(extraout_var_05,iVar5),(string *)&local_48);
        goto LAB_0011f9ab;
      }
      this = (Bad_manipulation *)__cxa_allocate_exception(0x10);
      Bad_manipulation::runtime_error(this,"String assigned to non-string.");
    }
  }
  else {
    if (bVar13) {
      uVar1 = val->flags_;
      if ((uVar1 >> 8 & 1) == 0) {
LAB_0011fae4:
        __assert_fail("IsBool()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/siggame[P]Joueur/joueur/libraries/rapidjson/include/rapidjson/document.h"
                      ,0x31a,
                      "bool rapidjson::GenericValue<rapidjson::UTF8<>>::GetBool() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                     );
      }
      _Var9._M_head_impl = (holder *)operator_new(0x10);
      (_Var9._M_head_impl)->_vptr_holder = (_func_int **)&PTR__holder_0013a2e0;
      *(bool *)&_Var9._M_head_impl[1]._vptr_holder = uVar1 == 0x102;
      goto LAB_0011fa9e;
    }
    _Var9._M_head_impl =
         (to_morph->data_)._M_t.
         super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
         ._M_t.
         super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
         .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl;
    if (_Var9._M_head_impl == (holder *)0x0) {
      puVar6 = &void::typeinfo;
    }
    else {
      iVar5 = (*(_Var9._M_head_impl)->_vptr_holder[2])();
      puVar6 = (undefined *)CONCAT44(extraout_var_01,iVar5);
    }
    pcVar3 = *(char **)(puVar6 + 8);
    if ((pcVar3 == _replace) || ((*pcVar3 != '*' && (iVar5 = strcmp(pcVar3,_replace), iVar5 == 0))))
    {
      uVar1 = val->flags_;
      if ((uVar1 >> 8 & 1) != 0) {
        pbVar7 = Any::as<bool>(to_morph);
        *pbVar7 = uVar1 == 0x102;
        return;
      }
      goto LAB_0011fae4;
    }
    this = (Bad_manipulation *)__cxa_allocate_exception(0x10);
    Bad_manipulation::runtime_error(this,"Boolean assigned to non-Boolean.");
  }
LAB_0011fbc0:
  ppuVar12 = &Bad_manipulation::typeinfo;
LAB_0011fbc7:
  __cxa_throw(this,ppuVar12,std::runtime_error::~runtime_error);
}

Assistant:

void morph_any(Any& to_morph, const rapidjson::Value& val)
{
   const bool no_type = (to_morph.type() == typeid(void));
   //otherwise just create the Any from it via this stupid if-else block
   if(val.IsBool())
   {
      if(!no_type && to_morph.type() != typeid(bool))
      {
         throw Bad_manipulation("Boolean assigned to non-Boolean.");
      }
      if(no_type)
      {
         to_morph = Any{val.GetBool()};
      }
      else
      {
         to_morph.as<bool>() = val.GetBool();
      }
   }
   else if(val.IsInt() && to_morph.type() != typeid(double))
   {
      if(!no_type && to_morph.type() != typeid(int))
      {
         throw Bad_manipulation("Integer assigned to non-Integer.");
      }
      if(no_type)
      {
         to_morph = Any{val.GetInt()};
      }
      else
      {
         to_morph.as<int>() = val.GetInt();
      }
   }
   else if(val.IsString())
   {
      if(!no_type && to_morph.type() != typeid(std::string))
      {
         throw Bad_manipulation("String assigned to non-string.");
      }
      if(no_type)
      {
         to_morph = Any{std::string{val.GetString()}};
      }
      else
      {
         to_morph.as<std::string>() = std::string{val.GetString()};
      }
   }
   else if(val.IsNumber())
   {
      if(!no_type && to_morph.type() != typeid(double))
      {
         throw Bad_manipulation("Double assigned to non-double.");
      }
      if(no_type)
      {
         to_morph = Any{static_cast<double>(val.GetDouble())};
      }
      else
      {
         to_morph.as<double>() = static_cast<double>(val.GetDouble());
      }
   }
   else if(val.IsNull())
   {
      to_morph.reset();
   }
   else
   {
      //some kind of weird gross type that's icky
      throw Bad_response("Unknown JSON type received in a delta.");
   }
}